

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::WindingCase::init(WindingCase *this,EVP_PKEY_CTX *ctx)

{
  TessPrimitiveType TVar1;
  Winding WVar2;
  Context *this_00;
  RenderContext *renderCtx;
  int iVar3;
  RenderTarget *renderTarget;
  char *pcVar4;
  ShaderProgram *this_01;
  ProgramSources *pPVar5;
  TestError *this_02;
  char *code;
  char *__rhs;
  SharedPtr<const_glu::ShaderProgram> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string fragmentShaderTemplate;
  undefined1 local_240 [40];
  undefined1 local_218 [40];
  undefined1 local_1f0 [40];
  undefined1 local_1c8 [40];
  string local_1a0;
  string local_180;
  string tessellationEvaluationTemplate;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  ProgramSources local_100;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexShaderTemplate,"${GLSL_VERSION_DECL}\n\nvoid main (void)\n{\n}\n",
             (allocator<char> *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tessellationControlTemplate,
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 1) out;\n\nvoid main (void)\n{\n\tgl_TessLevelInner[0] = 5.0;\n\tgl_TessLevelInner[1] = 5.0;\n\n\tgl_TessLevelOuter[0] = 5.0;\n\tgl_TessLevelOuter[1] = 5.0;\n\tgl_TessLevelOuter[2] = 5.0;\n\tgl_TessLevelOuter[3] = 5.0;\n}\n"
             ,(allocator<char> *)&local_100);
  TVar1 = this->m_primitiveType;
  WVar2 = this->m_winding;
  fragmentShaderTemplate._M_dataplus._M_p = (pointer)&fragmentShaderTemplate.field_2;
  fragmentShaderTemplate._M_string_length = 0;
  fragmentShaderTemplate.field_2._M_local_buf[0] = '\0';
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                 &fragmentShaderTemplate,"layout (");
  if (TVar1 < TESSPRIMITIVETYPE_LAST) {
    pcVar4 = (char *)(&DAT_01e48d80)[TVar1];
  }
  else {
    pcVar4 = (char *)0x0;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                 pcVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,", "
                );
  pcVar4 = (char *)0x0;
  code = "cw";
  if (WVar2 == WINDING_CW) {
    pcVar4 = "cw";
  }
  __rhs = "ccw";
  if (WVar2 != WINDING_CCW) {
    __rhs = pcVar4;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
                 __rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8,
                 glcts::fixed_sample_locations_values + 1);
  std::operator+(&local_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 ") in;\n");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::string::~string((string *)local_240);
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::operator+(&local_280,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",&local_2a0);
  std::operator+(&tessellationEvaluationTemplate,&local_280,
                 "\nvoid main (void)\n{\n\tgl_Position = vec4(gl_TessCoord.xy*2.0 - 1.0, 0.0, 1.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nvoid main (void)\n{\n\to_color = vec4(1.0);\n}\n"
             ,(allocator<char> *)&local_100);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_280,(_anonymous_namespace_ *)this_00,
             (Context *)vertexShaderTemplate._M_dataplus._M_p,code);
  glu::VertexSource::VertexSource((VertexSource *)local_1c8,&local_280);
  pPVar5 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_1c8);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2a0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationControlTemplate._M_dataplus._M_p,code);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_1f0,&local_2a0);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_1f0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_180,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationEvaluationTemplate._M_dataplus._M_p,code);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_218,&local_180);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_218);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1a0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)fragmentShaderTemplate._M_dataplus._M_p,code);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_240,&local_1a0);
  pPVar5 = glu::ProgramSources::operator<<(pPVar5,(ShaderSource *)local_240);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,pPVar5);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_2b0,this_01);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_2b0);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_2b0);
  std::__cxx11::string::~string((string *)(local_240 + 8));
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)(local_218 + 8));
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)(local_1f0 + 8));
  std::__cxx11::string::~string((string *)&local_2a0);
  std::__cxx11::string::~string((string *)(local_1c8 + 8));
  std::__cxx11::string::~string((string *)&local_280);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
    std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
    std::__cxx11::string::~string((string *)&tessellationControlTemplate);
    iVar3 = std::__cxx11::string::~string((string *)&vertexShaderTemplate);
    return iVar3;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0xae0);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void WindingCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 "layout (vertices = 1) out;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													 "	gl_TessLevelOuter[0] = 5.0;\n"
													 "	gl_TessLevelOuter[1] = 5.0;\n"
													 "	gl_TessLevelOuter[2] = 5.0;\n"
													 "	gl_TessLevelOuter[3] = 5.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
													 "\n"
													 + getTessellationEvaluationInLayoutString(m_primitiveType, m_winding) +
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	gl_Position = vec4(gl_TessCoord.xy*2.0 - 1.0, 0.0, 1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = vec4(1.0);\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}